

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintShortRepeatedField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  int iVar1;
  int local_38;
  int i;
  int size;
  TextGenerator *generator_local;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  Printer *this_local;
  
  PrintFieldName(this,message,reflection,field,generator);
  iVar1 = (*reflection->_vptr_Reflection[6])(reflection,message,field);
  TextGenerator::Print(generator,": [");
  for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
    if (0 < local_38) {
      TextGenerator::Print(generator,", ");
    }
    PrintFieldValue(this,message,reflection,field,local_38,generator);
  }
  if ((this->single_line_mode_ & 1U) == 0) {
    TextGenerator::Print(generator,"]\n");
  }
  else {
    TextGenerator::Print(generator,"] ");
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintShortRepeatedField(
    const Message& message,
    const Reflection* reflection,
    const FieldDescriptor* field,
    TextGenerator& generator) const {
  // Print primitive repeated field in short form.
  PrintFieldName(message, reflection, field, generator);

  int size = reflection->FieldSize(message, field);
  generator.Print(": [");
  for (int i = 0; i < size; i++) {
    if (i > 0) generator.Print(", ");
    PrintFieldValue(message, reflection, field, i, generator);
  }
  if (single_line_mode_) {
    generator.Print("] ");
  } else {
    generator.Print("]\n");
  }
}